

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O2

void __thiscall
ParticleTest_GetGamma_Test<pica::Particle<(pica::Dimension)2>_>::TestBody
          (ParticleTest_GetGamma_Test<pica::Particle<(pica::Dimension)2>_> *this)

{
  FP *pFVar1;
  char *pcVar2;
  double dVar3;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  AssertHelper local_78;
  AssertionResult gtest_ar;
  double local_60;
  ParticleType particle;
  
  BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>::randomParticle
            (&particle,(BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *)this);
  pica::Particle<(pica::Dimension)2>::getMomentum(&particle);
  dVar3 = *(double *)(pica::ParticleTypes::types + (long)particle.typeIndex * 0x10) * 29979245800.0;
  dVar3 = SQRT((local_60 * local_60 +
               (double)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) *
               (double)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) +
               (double)gtest_ar.message_.ptr_ * (double)gtest_ar.message_.ptr_) / (dVar3 * dVar3) +
               1.0);
  (this->super_ParticleTest<pica::Particle<(pica::Dimension)2>_>).
  super_BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>.super_BaseFixture.maxRelativeError
       = 1e-12;
  pFVar1 = &(this->super_ParticleTest<pica::Particle<(pica::Dimension)2>_>).
            super_BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>.super_BaseFixture.
            maxAbsoluteError;
  if (ABS(dVar3) < *pFVar1 || ABS(dVar3) == *pFVar1) {
    local_80.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ABS(dVar3 + -1.0 / particle.invGamma);
    testing::internal::CmpHelperLE<double,double>
              ((internal *)&gtest_ar,"fabs(expectedGamma - particle.getGamma())",
               "this->maxAbsoluteError",(double *)&local_80,
               &(this->super_ParticleTest<pica::Particle<(pica::Dimension)2>_>).
                super_BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>.super_BaseFixture.
                maxAbsoluteError);
    if (gtest_ar.success_ != false) goto LAB_00197968;
    testing::Message::Message((Message *)&local_80);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
               ,0xa3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
  }
  else {
    local_80.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ABS((-1.0 / particle.invGamma + dVar3) / dVar3);
    testing::internal::CmpHelperLE<double,double>
              ((internal *)&gtest_ar,
               "fabs(expectedGamma - particle.getGamma()) / fabs(expectedGamma)",
               "this->maxRelativeError",(double *)&local_80,
               &(this->super_ParticleTest<pica::Particle<(pica::Dimension)2>_>).
                super_BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>.super_BaseFixture.
                maxRelativeError);
    if (gtest_ar.success_ != false) goto LAB_00197968;
    testing::Message::Message((Message *)&local_80);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
               ,0xa3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_78);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_80);
LAB_00197968:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TYPED_TEST(ParticleTest, GetGamma)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::GammaType GammaType;

    ParticleType particle = this->randomParticle();
    GammaType expectedGamma = sqrt(static_cast<GammaType>(1.0) + particle.getMomentum().norm2() /
        sqr(particle.getMass() * Constants<GammaType>::c()));
    this->maxRelativeError = 1e-12;
    ASSERT_NEAR_FP(expectedGamma, particle.getGamma());
}